

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O1

void __thiscall SQInstance::Init(SQInstance *this,SQSharedState *ss)

{
  SQUnsignedInteger *pSVar1;
  SQClass *pSVar2;
  
  this->_userpointer = (SQUserPointer)0x0;
  this->_hook = (SQRELEASEHOOK)0x0;
  pSVar2 = this->_class;
  pSVar1 = &(pSVar2->super_SQCollectable).super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  (this->super_SQDelegable)._delegate = pSVar2->_members;
  (this->super_SQDelegable).super_SQCollectable._next = (SQCollectable *)0x0;
  (this->super_SQDelegable).super_SQCollectable._prev = (SQCollectable *)0x0;
  (this->super_SQDelegable).super_SQCollectable._sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

void SQInstance::Init(SQSharedState *ss)
{
    _userpointer = NULL;
    _hook = NULL;
    __ObjAddRef(_class);
    _delegate = _class->_members;
    INIT_CHAIN();
    ADD_TO_CHAIN(&_sharedstate->_gc_chain, this);
}